

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall QtPrivate::QGenericArrayOps<QString>::eraseLast(QGenericArrayOps<QString> *this)

{
  qsizetype *pqVar1;
  
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            (&(this->super_QArrayDataPointer<QString>).ptr
              [(this->super_QArrayDataPointer<QString>).size + -1].d);
  pqVar1 = &(this->super_QArrayDataPointer<QString>).size;
  *pqVar1 = *pqVar1 + -1;
  return;
}

Assistant:

void eraseLast() noexcept
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(this->size);
        (this->end() - 1)->~T();
        --this->size;
    }